

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects_Buffer.cpp
# Opt level: O3

void __thiscall Effects_Buffer::Effects_Buffer(Effects_Buffer *this,bool center_only)

{
  Blip_Buffer *this_00;
  long lVar1;
  
  Multi_Buffer::Multi_Buffer(&this->super_Multi_Buffer,2);
  (this->super_Multi_Buffer)._vptr_Multi_Buffer = (_func_int **)&PTR__Effects_Buffer_00894980;
  this_00 = (Blip_Buffer *)&this->field_0x20;
  lVar1 = 0;
  do {
    Blip_Buffer::Blip_Buffer(this_00);
    lVar1 = lVar1 + -0x40;
    this_00 = this_00 + 1;
  } while (lVar1 != -0x1c0);
  (this->config_).pan_1 = -0.15000000596046448;
  (this->config_).pan_2 = 0.15000000596046448;
  (this->config_).reverb_level = 0.11999999731779099;
  (this->config_).echo_delay = 61.0;
  (this->config_).echo_level = 0.10000000149011612;
  *(undefined4 *)&(this->config_).reverb_delay = 0;
  *(undefined4 *)((long)&(this->config_).reverb_delay + 4) = 0x40560000;
  *(undefined4 *)&(this->config_).delay_variance = 0;
  *(undefined4 *)((long)&(this->config_).delay_variance + 4) = 0x40320000;
  (this->config_).effects_enabled = false;
  (this->reverb_buf).begin_ = (short *)0x0;
  (this->reverb_buf).size_ = 0;
  (this->echo_buf).begin_ = (short *)0x0;
  (this->echo_buf).size_ = 0;
  this->buf_count = (uint)!center_only * 4 + 3;
  this->reverb_pos = 0;
  this->echo_pos = 0;
  this->effects_enabled = false;
  this->stereo_remain = 0;
  this->effect_remain = 0;
  (*(this->super_Multi_Buffer)._vptr_Multi_Buffer[0xb])(this);
  return;
}

Assistant:

Effects_Buffer::Effects_Buffer( bool center_only ) : Multi_Buffer( 2 )
{
	buf_count = center_only ? max_buf_count - 4 : max_buf_count;
	
	echo_pos = 0;
	reverb_pos = 0;
	
	stereo_remain = 0;
	effect_remain = 0;
	effects_enabled = false;
	set_depth( 0 );
}